

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_helper.c
# Opt level: O2

int mmu_translate(CPUS390XState_conflict *env,target_ulong vaddr,int rw,uint64_t asc,
                 target_ulong *raddr,int *flags,uint64_t *tec)

{
  uint uVar1;
  _Bool _Var2;
  undefined7 extraout_var;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  target_ulong *ptVar8;
  uint uVar9;
  target_ulong tVar10;
  bool bVar11;
  bool bVar12;
  ulong local_50;
  target_ulong *local_48;
  undefined4 local_3c;
  byte *local_38;
  
  tVar10 = vaddr & 0xfffffffffffff000;
  uVar6 = asc >> 0x2e | tVar10 | (ulong)(rw != 1) * 0x400 + 0x400;
  *tec = uVar6;
  *flags = 7;
  uVar9 = (uint)vaddr;
  if ((vaddr < 0x2000) && ((env->cregs[0] & 0x10000000) != 0)) {
    if (((env->psw).mask & 0x400000000000000) != 0) {
      if (asc == 0) {
        lVar7 = 0x378;
      }
      else if (asc == 0xc00000000000) {
        lVar7 = 0x3d8;
      }
      else {
        if (asc != 0x800000000000) {
          exit(1);
        }
        lVar7 = 0x3a8;
      }
      if ((*(byte *)((long)env->regs + lVar7 + 1) & 1) != 0) goto LAB_00ae4853;
    }
    *flags = 0x47;
    if ((rw == 1) && (vaddr < 0x200 || (uVar9 & 0x1e00) == 0x1000)) {
      *tec = uVar6 | 0x80;
      return 4;
    }
  }
LAB_00ae4853:
  if (((env->psw).mask & 0x400000000000000) == 0) {
    *raddr = tVar10;
    goto LAB_00ae4e3f;
  }
  ptVar8 = *(target_ulong **)
            ((long)env->regs + *(long *)(&DAT_00bcad70 + (asc << 0x12 | asc >> 0x2e) * 8));
  bVar11 = true;
  if ((env->cregs[0] & 0x800000) == 0) {
    local_3c = 0;
    bVar12 = true;
  }
  else {
    local_48 = (target_ulong *)CONCAT44(local_48._4_4_,rw);
    _Var2 = s390_has_feat(env->uc,S390_FEAT_EDAT);
    bVar12 = !_Var2;
    if (bVar12) {
      local_3c = 0;
    }
    else {
      _Var2 = s390_has_feat(env->uc,S390_FEAT_EDAT_2);
      local_3c = (undefined4)CONCAT71(extraout_var,_Var2);
    }
    rw = (int)local_48;
  }
  if ((env->cregs[0] & 0x100000) != 0) {
    local_48 = ptVar8;
    _Var2 = s390_has_feat(env->uc,S390_FEAT_INSTRUCTION_EXEC_PROT);
    bVar11 = !_Var2;
    ptVar8 = local_48;
  }
  if (((ulong)ptVar8 & 0x20) == 0) {
    uVar3 = (uint)ptVar8 & 3;
    uVar6 = (ulong)ptVar8 & 0xfffffffffffff000;
    uVar1 = (uint)((ulong)ptVar8 >> 8);
    uVar5 = (uint)(vaddr >> 0x20);
    local_48 = raddr;
    switch((uint)((ulong)ptVar8 >> 2) & 3) {
    case 0:
      if (0x7fffffff < vaddr) {
        return 0x38;
      }
      if ((ulong)uVar3 < vaddr >> 0x1d) {
        return 0x10;
      }
      goto LAB_00ae4cff;
    case 1:
      if (vaddr >> 0x2a != 0) {
        return 0x38;
      }
      local_38 = (byte *)flags;
      if (uVar3 < uVar5 >> 8) {
        return 0x3b;
      }
      goto LAB_00ae4bf4;
    case 2:
      if (vaddr >> 0x35 != 0) {
        return 0x38;
      }
      local_38 = (byte *)flags;
      if (uVar3 < uVar5 >> 0x13) {
        return 0x3a;
      }
      break;
    case 3:
      if (uVar3 < uVar5 >> 0x1e) {
        return 0x39;
      }
      local_38 = (byte *)flags;
      _Var2 = read_table_entry(env,uVar6 + (vaddr >> 0x35) * 8,&local_50);
      if (!_Var2) {
        return 5;
      }
      if ((local_50 & 0x20) != 0) {
        return 0x39;
      }
      uVar3 = (uint)local_50;
      if ((~uVar3 & 0xc) != 0) {
        return 0x12;
      }
      uVar4 = uVar5 >> 0x13 & 3;
      if ((uVar3 & 3) < uVar4) {
        return 0x3a;
      }
      if (uVar4 < ((uint)(local_50 >> 6) & 3)) {
        return 0x3a;
      }
      if ((uVar3 >> 9 & 1) != 0 && !bVar12) {
        *local_38 = *local_38 & 0xfd;
      }
      uVar6 = local_50 & 0xfffffffffffff000;
    }
    _Var2 = read_table_entry(env,(uVar5 >> 7 & 0x3ff8) + uVar6,&local_50);
    if (!_Var2) {
      return 5;
    }
    if ((local_50 & 0x20) != 0) {
      return 0x3a;
    }
    uVar3 = (uint)local_50;
    if ((uVar3 & 0xc) != 8) {
      return 0x12;
    }
    uVar5 = uVar5 >> 8 & 3;
    if ((uVar3 & 3) < uVar5) {
      return 0x3b;
    }
    if (uVar5 < ((uint)(local_50 >> 6) & 3)) {
      return 0x3b;
    }
    if ((uVar3 >> 9 & 1) != 0 && !bVar12) {
      *local_38 = *local_38 & 0xfd;
    }
    uVar6 = local_50 & 0xfffffffffffff000;
LAB_00ae4bf4:
    _Var2 = read_table_entry(env,((uint)(vaddr >> 0x1c) & 0x3ff8) + uVar6,&local_50);
    if (!_Var2) {
      return 5;
    }
    if ((local_50 & 0x20) != 0) {
      return 0x3b;
    }
    uVar5 = (uint)local_50;
    if ((uVar5 & 0xc) != 4) {
      return 0x12;
    }
    if (((char)local_3c != '\0') && ((uVar1 & 0xffffff & (uVar5 & 0x10) >> 4) != 0)) {
      return 0x12;
    }
    if ((uVar5 >> 9 & 1) != 0 && !bVar12) {
      *local_38 = *local_38 & 0xfd;
    }
    flags = (int *)local_38;
    if ((char)local_3c == '\x01' && (uVar5 >> 10 & 1) != 0) {
      if (!bVar11 && (uVar5 >> 8 & 1) != 0) {
        *local_38 = *local_38 & 0xfb;
      }
      local_50 = local_50 & 0xffffffff80000000;
      uVar9 = uVar9 & 0x7ffff000;
    }
    else {
      uVar3 = (uint)(vaddr >> 0x1d) & 3;
      if (((uVar5 & 3) < uVar3) || (uVar3 < ((uint)(local_50 >> 6) & 3))) {
        return 0x10;
      }
      uVar6 = local_50 & 0xfffffffffffff000;
LAB_00ae4cff:
      _Var2 = read_table_entry(env,((uint)(vaddr >> 0x11) & 0x3ff8) + uVar6,&local_50);
      if (!_Var2) {
        return 5;
      }
      if ((local_50 & 0x20) != 0) {
        return 0x10;
      }
      if ((local_50 & 0xc) != 0) {
        return 0x12;
      }
      uVar5 = (uint)local_50;
      if ((uVar1 & 0xffffff & (uVar5 & 0x10) >> 4) != 0) {
        return 0x12;
      }
      if ((uVar5 >> 9 & 1) != 0) {
        *(byte *)flags = *(byte *)flags & 0xfd;
      }
      if (bVar12 || (uVar5 >> 10 & 1) == 0) {
        _Var2 = read_table_entry(env,(ulong)((uint)(vaddr >> 9) & 0x7f8) |
                                     local_50 & 0xfffffffffffff800,&local_50);
        if (!_Var2) {
          return 5;
        }
        uVar9 = (uint)local_50;
        if ((uVar9 >> 10 & 1) != 0) {
          return 0x11;
        }
        if ((uVar9 >> 0xb & 1) != 0) {
          return 0x12;
        }
        if ((uVar9 >> 9 & 1) != 0) {
          *(byte *)flags = *(byte *)flags & 0xfd;
        }
        if (!bVar11 && (uVar9 >> 8 & 1) != 0) {
          *(byte *)flags = *(byte *)flags & 0xfb;
        }
        tVar10 = local_50 & 0xfffffffffffff000;
        raddr = local_48;
        goto LAB_00ae4e1e;
      }
      if (!bVar11 && (uVar5 >> 8 & 1) != 0) {
        *(byte *)flags = *(byte *)flags & 0xfb;
      }
      local_50 = local_50 & 0xfffffffffff00000;
      uVar9 = uVar9 & 0xff000;
    }
    tVar10 = uVar9 | local_50;
    raddr = local_48;
  }
LAB_00ae4e1e:
  *raddr = tVar10;
  if (rw == 1) {
    if ((*(byte *)flags & 2) == 0) {
      *(byte *)tec = (byte)*tec | 4;
      return 4;
    }
  }
  else if ((rw == 2) && ((*(byte *)flags & 4) == 0)) {
    *(byte *)tec = (byte)*tec | 0x84;
    return 4;
  }
LAB_00ae4e3f:
  tVar10 = mmu_real2abs(env,tVar10);
  *raddr = tVar10;
  mmu_handle_skey((uc_struct *)env->uc,tVar10,rw,flags);
  return 0;
}

Assistant:

int mmu_translate(CPUS390XState *env, target_ulong vaddr, int rw, uint64_t asc,
                  target_ulong *raddr, int *flags, uint64_t *tec)
{
    uint64_t asce;
    int r;

    *tec = (vaddr & TARGET_PAGE_MASK) | (asc >> 46) |
            (rw == MMU_DATA_STORE ? FS_WRITE : FS_READ);
    *flags = PAGE_READ | PAGE_WRITE | PAGE_EXEC;

    if (is_low_address(vaddr & TARGET_PAGE_MASK) && lowprot_enabled(env, asc)) {
        /*
         * If any part of this page is currently protected, make sure the
         * TLB entry will not be reused.
         *
         * As the protected range is always the first 512 bytes of the
         * two first pages, we are able to catch all writes to these areas
         * just by looking at the start address (triggering the tlb miss).
         */
        *flags |= PAGE_WRITE_INV;
        if (is_low_address(vaddr) && rw == MMU_DATA_STORE) {
            /* LAP sets bit 56 */
            *tec |= 0x80;
            return PGM_PROTECTION;
        }
    }

    vaddr &= TARGET_PAGE_MASK;

    if (!(env->psw.mask & PSW_MASK_DAT)) {
        *raddr = vaddr;
        goto nodat;
    }

    switch (asc) {
    case PSW_ASC_PRIMARY:
        asce = env->cregs[1];
        break;
    case PSW_ASC_HOME:
        asce = env->cregs[13];
        break;
    case PSW_ASC_SECONDARY:
        asce = env->cregs[7];
        break;
    case PSW_ASC_ACCREG:
    default:
        // hw_error("guest switched to unknown asc mode\n");
        break;
    }

    /* perform the DAT translation */
    r = mmu_translate_asce(env, vaddr, asc, asce, raddr, flags, rw);
    if (unlikely(r)) {
        return r;
    }

    /* check for DAT protection */
    if (unlikely(rw == MMU_DATA_STORE && !(*flags & PAGE_WRITE))) {
        /* DAT sets bit 61 only */
        *tec |= 0x4;
        return PGM_PROTECTION;
    }

    /* check for Instruction-Execution-Protection */
    if (unlikely(rw == MMU_INST_FETCH && !(*flags & PAGE_EXEC))) {
        /* IEP sets bit 56 and 61 */
        *tec |= 0x84;
        return PGM_PROTECTION;
    }

nodat:
    /* Convert real address -> absolute address */
    *raddr = mmu_real2abs(env, *raddr);

    mmu_handle_skey(env->uc, *raddr, rw, flags);
    return 0;
}